

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall wasm_module_t::wasm_module_t(wasm_module_t *this,wasm_module_t *other)

{
  RefPtr<wabt::interp::Object> local_30;
  
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr
            (&local_30,(RefPtr<wabt::interp::Object> *)other);
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr((RefPtr<wabt::interp::Object> *)this,&local_30)
  ;
  wabt::interp::RefPtr<wabt::interp::Object>::reset(&local_30);
  wasm_byte_vec_copy(&this->binary,&other->binary);
  return;
}

Assistant:

wasm_module_t(const wasm_module_t& other) : wasm_ref_t(other.I) {
    wasm_byte_vec_copy(&binary, &other.binary);
  }